

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresstype.h
# Opt level: O1

bool operator==(WitnessUnknown *w1,WitnessUnknown *w2)

{
  long lVar1;
  pointer __s1;
  pointer puVar2;
  pointer __s2;
  int iVar3;
  size_t __n;
  long in_FS_OFFSET;
  bool bVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (w1->m_version == w2->m_version) {
    __s1 = (w1->m_program).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
    puVar2 = (w1->m_program).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    __n = (long)puVar2 - (long)__s1;
    __s2 = (w2->m_program).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
    if (__n == (long)(w2->m_program).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)__s2) {
      if (puVar2 == __s1) {
        bVar4 = true;
      }
      else {
        iVar3 = bcmp(__s1,__s2,__n);
        bVar4 = iVar3 == 0;
      }
      goto LAB_0031e765;
    }
  }
  bVar4 = false;
LAB_0031e765:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool operator==(const WitnessUnknown& w1, const WitnessUnknown& w2) {
        if (w1.GetWitnessVersion() != w2.GetWitnessVersion()) return false;
        return w1.GetWitnessProgram() == w2.GetWitnessProgram();
    }